

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O0

char * M680X_reg_name(csh handle,uint reg)

{
  uint reg_local;
  csh handle_local;
  char (*local_8) [10];
  
  if (reg < 0x16) {
    local_8 = s_reg_names + (int)reg;
  }
  else {
    local_8 = (char (*) [10])0x0;
  }
  return *local_8;
}

Assistant:

const char *M680X_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET

	if (reg >= ARR_SIZE(s_reg_names))
		return NULL;

	return s_reg_names[(int)reg];
#else
	return NULL;
#endif
}